

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_resize(JSON_Array *array,size_t new_capacity)

{
  JSON_Value **__dest;
  JSON_Value **new_items;
  size_t new_capacity_local;
  JSON_Array *array_local;
  
  if (new_capacity == 0) {
    array_local._4_4_ = -1;
  }
  else {
    __dest = (JSON_Value **)(*parson_malloc)(new_capacity << 3);
    if (__dest == (JSON_Value **)0x0) {
      array_local._4_4_ = -1;
    }
    else {
      if ((array->items != (JSON_Value **)0x0) && (array->count != 0)) {
        memcpy(__dest,array->items,array->count << 3);
      }
      (*parson_free)(array->items);
      array->items = __dest;
      array->capacity = new_capacity;
      array_local._4_4_ = 0;
    }
  }
  return array_local._4_4_;
}

Assistant:

static JSON_Status json_array_resize(JSON_Array *array, size_t new_capacity) {
    JSON_Value **new_items = NULL;
    if (new_capacity == 0) {
        return JSONFailure;
    }
    new_items = (JSON_Value**)parson_malloc(new_capacity * sizeof(JSON_Value*));
    if (new_items == NULL) {
        return JSONFailure;
    }
    if (array->items != NULL && array->count > 0) {
        memcpy(new_items, array->items, array->count * sizeof(JSON_Value*));
    }
    parson_free(array->items);
    array->items = new_items;
    array->capacity = new_capacity;
    return JSONSuccess;
}